

Human: Reconstruct the original C/C++ source from this Ghidra decompilation:

# unqlite.c
# Opt level: O3

int jx9Builtin_stripos(jx9_context *pCtx,int nArg,jx9_value **apArg)

{
  uint uVar1;
  sxi32 sVar2;
  uint uVar3;
  char *pText;
  char *pPattern;
  jx9_value *pjVar4;
  anon_union_8_3_18420de5_for_x aVar5;
  int nLen;
  sxu32 nOfft;
  int nPatLen;
  sxu32 local_34;
  sxu32 local_30;
  sxu32 local_2c;
  
  if (1 < nArg) {
    pText = jx9_value_to_string(*apArg,(int *)&local_34);
    pPattern = jx9_value_to_string(apArg[1],(int *)&local_2c);
    local_30 = 0;
    if (nArg == 2) {
      uVar3 = 0;
    }
    else {
      pjVar4 = apArg[2];
      jx9MemObjToInteger(pjVar4);
      uVar3 = *(uint *)&pjVar4->x;
      uVar1 = -uVar3;
      if (0 < (int)uVar3) {
        uVar1 = uVar3;
      }
      uVar3 = 0;
      if (local_34 - uVar1 != 0 && (int)uVar1 <= (int)local_34) {
        pText = pText + uVar1;
        uVar3 = uVar1;
        local_34 = local_34 - uVar1;
      }
    }
    if (0 < (int)local_2c && 0 < (int)local_34) {
      sVar2 = iPatternMatch(pText,local_34,pPattern,local_2c,&local_30);
      if (sVar2 == 0) {
        aVar5._0_4_ = uVar3 + local_30;
        aVar5.iVal._4_4_ = 0;
        pjVar4 = pCtx->pRet;
        jx9MemObjRelease(pjVar4);
        pjVar4->x = aVar5;
        uVar3 = 2;
        goto LAB_00130dcc;
      }
    }
  }
  pjVar4 = pCtx->pRet;
  jx9MemObjRelease(pjVar4);
  (pjVar4->x).rVal = 0.0;
  uVar3 = 8;
LAB_00130dcc:
  pjVar4->iFlags = pjVar4->iFlags & 0xfffffe90U | uVar3;
  return 0;
}

Assistant:

static int jx9Builtin_stripos(jx9_context *pCtx, int nArg, jx9_value **apArg)
{
	ProcStringMatch xPatternMatch = iPatternMatch; /* Case-insensitive pattern match */
	const char *zBlob, *zPattern;
	int nLen, nPatLen, nStart;
	sxu32 nOfft;
	sxi32 rc;
	if( nArg < 2 ){
		/* Missing arguments, return FALSE */
		jx9_result_bool(pCtx, 0);
		return JX9_OK;
	}
	/* Extract the needle and the haystack */
	zBlob = jx9_value_to_string(apArg[0], &nLen);
	zPattern = jx9_value_to_string(apArg[1], &nPatLen);
	nOfft = 0; /* cc warning */
	nStart = 0;
	/* Peek the starting offset if available */
	if( nArg > 2 ){
		nStart = jx9_value_to_int(apArg[2]);
		if( nStart < 0 ){
			nStart = -nStart;
		}
		if( nStart >= nLen ){
			/* Invalid offset */
			nStart = 0;
		}else{
			zBlob += nStart;
			nLen -= nStart;
		}
	}
	if( nLen > 0 && nPatLen > 0 ){
		/* Perform the lookup */
		rc = xPatternMatch(zBlob, (sxu32)nLen, zPattern, (sxu32)nPatLen, &nOfft);
		if( rc != SXRET_OK ){
			/* Pattern not found, return FALSE */
			jx9_result_bool(pCtx, 0);
			return JX9_OK;
		}
		/* Return the pattern position */
		jx9_result_int64(pCtx, (jx9_int64)(nOfft+nStart));
	}else{
		jx9_result_bool(pCtx, 0);
	}
	return JX9_OK;
}